

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::lowerExtendSInt32(I64ToI32Lowering *this,Unary *curr)

{
  Builder *pBVar1;
  undefined4 uVar2;
  LocalSet *pLVar3;
  Expression *pEVar4;
  Const *pCVar5;
  Binary *this_00;
  Block *pBVar6;
  Block *local_88;
  undefined1 local_80 [8];
  TempVar highBits;
  undefined1 local_58 [8];
  TempVar lowBits;
  
  getTemp((TempVar *)local_80,this,(Type)0x2);
  getTemp((TempVar *)local_58,this,(Type)0x2);
  if ((char)lowBits.pass != '\x01') {
    pLVar3 = Builder::makeLocalSet
                       ((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,local_58._0_4_,
                        curr->value);
    uVar2 = local_58._0_4_;
    if (((char)highBits.pass != '\x01') &&
       (highBits.ty.id = (uintptr_t)pLVar3, (char)lowBits.pass != '\x01')) {
      pBVar1 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      lowBits.ty.id._4_4_ = local_80._0_4_;
      pEVar4 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
      pEVar4->_id = LocalGetId;
      pEVar4[1]._id = uVar2;
      (pEVar4->type).id = 2;
      pCVar5 = Builder::makeConst<int>
                         ((this->builder)._M_t.
                          super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                          .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0x1f);
      this_00 = (Binary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
      (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      this_00->op = ShrSInt32;
      this_00->left = pEVar4;
      this_00->right = (Expression *)pCVar5;
      Binary::finalize(this_00);
      pLVar3 = Builder::makeLocalSet(pBVar1,lowBits.ty.id._4_4_,(Expression *)this_00);
      if ((char)lowBits.pass != '\x01') {
        pBVar1 = (this->builder)._M_t.
                 super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                 super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
        pEVar4 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
        pEVar4->_id = LocalGetId;
        pEVar4[1]._id = local_58._0_4_;
        (pEVar4->type).id = 2;
        pBVar6 = Builder::blockify(pBVar1,(Expression *)highBits.ty.id,(Expression *)pLVar3);
        pBVar6 = Builder::blockify(pBVar1,(Expression *)pBVar6,pEVar4);
        local_88 = pBVar6;
        std::
        _Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<wasm::Expression*&,wasm::I64ToI32Lowering::TempVar>
                  ((_Hashtable<wasm::Expression*,std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>,std::allocator<std::pair<wasm::Expression*const,wasm::I64ToI32Lowering::TempVar>>,std::__detail::_Select1st,std::equal_to<wasm::Expression*>,std::hash<wasm::Expression*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->highBitVars,&local_88,local_80);
        Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                  (&(this->
                    super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                    ).
                    super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                    .
                    super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                   ,(Expression *)pBVar6);
        TempVar::~TempVar((TempVar *)local_58);
        TempVar::~TempVar((TempVar *)local_80);
        return;
      }
    }
  }
  __assert_fail("!moved",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x4c,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
}

Assistant:

void lowerExtendSInt32(Unary* curr) {
    TempVar highBits = getTemp();
    TempVar lowBits = getTemp();

    LocalSet* setLow = builder->makeLocalSet(lowBits, curr->value);
    LocalSet* setHigh = builder->makeLocalSet(
      highBits,
      builder->makeBinary(ShrSInt32,
                          builder->makeLocalGet(lowBits, Type::i32),
                          builder->makeConst(int32_t(31))));

    Block* result = builder->blockify(
      setLow, setHigh, builder->makeLocalGet(lowBits, Type::i32));

    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
  }